

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O1

void __thiscall
just::test::assert_equal_container::
run<std::vector<char,std::allocator<char>>,std::vector<char,std::allocator<char>>>
          (assert_equal_container *this,vector<char,_std::allocator<char>_> *a_,
          vector<char,_std::allocator<char>_> *b_)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  ostringstream s;
  string local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Expected: ",10);
  show<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
            ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
             (a_->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                      (a_->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish,(ostream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," == ",4);
  show<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
            ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
             (b_->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                      (b_->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish,(ostream *)local_198);
  std::__cxx11::stringbuf::str();
  pcVar3 = (a_->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pcVar1 = (a_->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  pcVar4 = (b_->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pcVar2 = (b_->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pcVar4 != pcVar2 && pcVar3 != pcVar1) {
    while (*pcVar3 == *pcVar4) {
      pcVar3 = pcVar3 + 1;
      pcVar4 = pcVar4 + 1;
      if ((pcVar3 == pcVar1) || (pcVar4 == pcVar2)) break;
    }
  }
  assert_msg::operator()(&this->_assert_msg,&local_1b8,pcVar4 == pcVar2 && pcVar3 == pcVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void run(const A& a_, const B& b_) const
      {
        std::ostringstream s;
        s << "Expected: ";
        show(a_.begin(), a_.end(), s);
        s << " == ";
        show(b_.begin(), b_.end(), s);

        _assert_msg(
          s.str(),
          ::just::test::equal(a_.begin(), a_.end(), b_.begin(), b_.end())
        );
      }